

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::
SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>_>
::clear(SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>_>
        *this)

{
  void *pvVar1;
  void *pvVar2;
  
  pvVar1 = (this->
           super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
           .super_SmallVectorBase.BeginX;
  pvVar2 = (this->
           super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
           .super_SmallVectorBase.EndX;
  if (pvVar2 != pvVar1) {
    do {
      if ((void *)((long)pvVar2 + -0xf0) != *(void **)((long)pvVar2 + -0x108)) {
        free(*(void **)((long)pvVar2 + -0x108));
      }
      pvVar2 = (void *)((long)pvVar2 + -0x138);
    } while (pvVar2 != pvVar1);
    pvVar1 = (this->
             super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
             ).
             super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
             .super_SmallVectorBase.BeginX;
  }
  (this->
  super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_false>
  ).
  super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<887U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<888U,_Fixpp::Type::String>,_Fixpp::TagT<889U,_Fixpp::Type::String>_>_>,_void>
  .super_SmallVectorBase.EndX = pvVar1;
  return;
}

Assistant:

void clear() {
    this->destroy_range(this->begin(), this->end());
    this->EndX = this->BeginX;
  }